

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cookptravltree.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  char **argv_local;
  int argc_local;
  
  iVar1 = test1();
  if (iVar1 == 0) {
    iVar1 = test2();
    if (iVar1 == 0) {
      iVar1 = test3();
      if (iVar1 == 0) {
        iVar1 = test4();
        if (iVar1 == 0) {
          argv_local._4_4_ = 0;
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,200);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          argv_local._4_4_ = 1;
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,199);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 1;
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc6);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc5);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int
main (int argc, const char* argv[])
{
    ASSERT_EQ (0, test1 ());
    ASSERT_EQ (0, test2 ());
    ASSERT_EQ (0, test3 ());
    ASSERT_EQ (0, test4 ());
    return 0;
}